

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastGdS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  uint *puVar5;
  MessageLite **ppMVar6;
  TcParseTableBase *table_00;
  MessageLite *msg_00;
  ulong uVar7;
  Nonnull<const_char_*> failure_msg;
  ushort *puVar8;
  char *pcVar9;
  ushort *puVar10;
  int iVar11;
  Arena *arena;
  ushort *local_48 [2];
  int local_38;
  uint local_34;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  local_34 = (uint)(byte)*ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar5 = *puVar5 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  ppMVar6 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)data.field_0 >> 0x30);
  table_00 = MessageLite::GetTcParseTable
                       (*(MessageLite **)
                         ((long)&table->has_bits_offset +
                         ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  msg_00 = *ppMVar6;
  if (msg_00 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    msg_00 = ClassData::New(table_00->class_data,arena);
    *ppMVar6 = msg_00;
  }
  iVar11 = ctx->depth_;
  local_38 = iVar11 + -1;
  ctx->depth_ = local_38;
  if (iVar11 < 1) {
    return (char *)0x0;
  }
  local_48[0] = (ushort *)(ptr + 1);
  iVar11 = ctx->group_depth_ + 1;
  ctx->group_depth_ = iVar11;
  while (bVar3 = ParseContext::Done(ctx,(char **)local_48), !bVar3) {
    uVar4 = (uint)table_00->fast_idx_mask & (uint)*local_48[0];
    if ((uVar4 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar7 = (ulong)(uVar4 & 0xfffffff8);
    local_48[0] = (ushort *)
                  (**(code **)(&table_00[1].has_bits_offset + uVar7))
                            (msg_00,local_48[0],ctx,
                             (ulong)*local_48[0] ^
                             *(ulong *)(&table_00[1].fast_idx_mask + uVar7 * 2),table_00,0);
    if ((local_48[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
    break;
  }
  if ((table_00->field_0x9 & 1) == 0) {
    puVar10 = local_48[0];
    if (local_48[0] == (ushort *)0x0) {
      VerifyHasBitConsistency(msg_00,table_00);
      puVar10 = local_48[0];
      goto LAB_001dc485;
    }
  }
  else {
    puVar10 = (ushort *)(*table_00->post_loop_handler)(msg_00,(char *)local_48[0],ctx);
LAB_001dc485:
    if (puVar10 == (ushort *)0x0) {
      puVar10 = (ushort *)0x0;
      goto LAB_001dc407;
    }
  }
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                          (local_38,ctx->depth_,"old_depth == depth_");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                            (iVar11,ctx->group_depth_,"old_group_depth == group_depth_");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
LAB_001dc407:
      uVar1 = ctx->depth_;
      uVar2 = ctx->group_depth_;
      ctx->depth_ = uVar1 + 1;
      ctx->group_depth_ = uVar2 + -1;
      uVar4 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      puVar8 = (ushort *)0x0;
      if (uVar4 == local_34) {
        puVar8 = puVar10;
      }
      return (char *)puVar8;
    }
    iVar11 = 0x492;
  }
  else {
    iVar11 = 0x491;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
             ,iVar11,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_48);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}